

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite_Internals.cpp
# Opt level: O0

Type * anon_unknown.dwarf_3c7d63::synonymizedType(SemanticModel *semaModel,Type *ty)

{
  TypeKind TVar1;
  int iVar2;
  undefined4 extraout_var;
  TypedefDeclarationSymbol *pTVar3;
  undefined4 extraout_var_00;
  Type *pTVar4;
  Type *actualTy;
  Type *ty_local;
  SemanticModel *semaModel_local;
  
  TVar1 = psy::C::Type::kind(ty);
  if (TVar1 == TypedefName) {
    iVar2 = (*ty->_vptr_Type[0xb])();
    pTVar3 = psy::C::TypedefNameType::declaration((TypedefNameType *)CONCAT44(extraout_var,iVar2));
    if (pTVar3 != (TypedefDeclarationSymbol *)0x0) {
      iVar2 = (*ty->_vptr_Type[0xb])();
      pTVar3 = psy::C::TypedefNameType::declaration
                         ((TypedefNameType *)CONCAT44(extraout_var_00,iVar2));
      pTVar4 = psy::C::TypedefDeclarationSymbol::synonymizedType(pTVar3);
      if (pTVar4 != (Type *)0x0) {
        return pTVar4;
      }
    }
  }
  return ty;
}

Assistant:

const Type* synonymizedType(const SemanticModel* semaModel, const Type* ty)
{
    if (ty->kind() == TypeKind::TypedefName
            && ty->asTypedefNameType()->declaration()) {
        auto actualTy = ty->asTypedefNameType()->declaration()->synonymizedType();
        if (actualTy)
            return actualTy;
    }
    return ty;
}